

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

type * __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
as<(anonymous_namespace)::ns::Value>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  type *in_RDI;
  Value *val;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_000000a8;
  
  json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_(anonymous_namespace)::ns::Value,_void>
  ::as(in_stack_000000a8);
  return in_RDI;
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }